

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall detail::writer::operator()(writer *this,string *val)

{
  size_t n;
  mutable_buffer mVar1;
  void *local_40;
  size_t local_38;
  const_buffer local_30;
  unsigned_short local_1a;
  string *local_18;
  string *val_local;
  writer *this_local;
  
  local_18 = val;
  val_local = (string *)this;
  local_1a = std::__cxx11::string::size();
  operator()(this,&local_1a);
  local_30 = (const_buffer)
             boost::asio::buffer<char,std::char_traits<char>,std::allocator<char>>(local_18);
  boost::asio::buffer_copy<boost::asio::mutable_buffer,boost::asio::const_buffers_1>
            (&this->buf_,(const_buffers_1 *)&local_30);
  n = std::__cxx11::string::length();
  mVar1 = boost::asio::operator+(&this->buf_,n);
  local_40 = mVar1.data_;
  (this->buf_).data_ = local_40;
  local_38 = mVar1.size_;
  (this->buf_).size_ = local_38;
  return;
}

Assistant:

void operator()(std::string const& val) const {
        (*this)(static_cast<uint16_t>(val.size()));
        asio::buffer_copy(buf_, asio::buffer(val));
        buf_ = buf_ + val.length();
    }